

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int iso9660_free(archive_write *a)

{
  void *__ptr;
  void *pvVar1;
  isofile *piVar2;
  isofile *file;
  int iVar3;
  archive_rb_node *self;
  archive_rb_node *paVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  __ptr = a->format_data;
  if (-1 < *(int *)((long)__ptr + 8)) {
    close(*(int *)((long)__ptr + 8));
  }
  pvVar1 = a->format_data;
  free(*(void **)((long)pvVar1 + 0x220));
  iVar5 = 0;
  if ((*(int *)((long)pvVar1 + 0x2b8) != 0) &&
     (iVar3 = deflateEnd((long)pvVar1 + 0x248), iVar5 = 0, iVar3 != 0)) {
    archive_set_error(&a->archive,-1,"Failed to clean up compressor");
    iVar5 = -0x1e;
  }
  *(undefined8 *)((long)pvVar1 + 0x220) = 0;
  *(undefined4 *)((long)pvVar1 + 0x2b8) = 0;
  isoent_free_all(*(isoent **)((long)__ptr + 0xb8));
  if (0 < *(int *)((long)__ptr + 0xd0)) {
    lVar7 = 0x10;
    lVar6 = 0;
    do {
      free(*(void **)(*(long *)((long)__ptr + 200) + lVar7));
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x20;
    } while (lVar6 < *(int *)((long)__ptr + 0xd0));
  }
  free(*(void **)((long)__ptr + 200));
  if ((*(byte *)((long)__ptr + 0x10372) & 6) != 0) {
    isoent_free_all(*(isoent **)((long)__ptr + 0xe8));
    if (0 < *(int *)((long)__ptr + 0x100)) {
      lVar7 = 0x10;
      lVar6 = 0;
      do {
        free(*(void **)(*(long *)((long)__ptr + 0xf8) + lVar7));
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar6 < *(int *)((long)__ptr + 0x100));
    }
    free(*(void **)((long)__ptr + 0xf8));
  }
  file = *(isofile **)((long)__ptr + 0x88);
  while (file != (isofile *)0x0) {
    piVar2 = file->allnext;
    isofile_free(file);
    file = piVar2;
  }
  self = __archive_rb_tree_iterate((archive_rb_tree *)((long)__ptr + 0xa8),(archive_rb_node *)0x0,0)
  ;
  while (self != (archive_rb_node *)0x0) {
    paVar4 = __archive_rb_tree_iterate((archive_rb_tree *)((long)__ptr + 0xa8),self,1);
    free(self);
    self = paVar4;
  }
  archive_string_free((archive_string *)((long)__ptr + 0x20));
  archive_string_free((archive_string *)((long)__ptr + 0x128));
  archive_string_free((archive_string *)((long)__ptr + 0x140));
  archive_string_free((archive_string *)((long)__ptr + 0x158));
  archive_string_free((archive_string *)((long)__ptr + 0x170));
  archive_string_free((archive_string *)((long)__ptr + 0x188));
  archive_string_free((archive_string *)((long)__ptr + 0x1a0));
  archive_string_free((archive_string *)((long)__ptr + 0x1b8));
  archive_string_free((archive_string *)((long)__ptr + 0x10308));
  archive_string_free((archive_string *)((long)__ptr + 0x10328));
  archive_string_free((archive_string *)((long)__ptr + 0x10350));
  archive_string_free((archive_string *)((long)__ptr + 0x48));
  archive_string_free((archive_string *)((long)__ptr + 0x60));
  free(__ptr);
  a->format_data = (void *)0x0;
  return iVar5;
}

Assistant:

static int
iso9660_free(struct archive_write *a)
{
	struct iso9660 *iso9660;
	int i, ret;

	iso9660 = a->format_data;

	/* Close the temporary file. */
	if (iso9660->temp_fd >= 0)
		close(iso9660->temp_fd);

	/* Free some stuff for zisofs operations. */
	ret = zisofs_free(a);

	/* Remove directory entries in tree which includes file entries. */
	isoent_free_all(iso9660->primary.rootent);
	for (i = 0; i < iso9660->primary.max_depth; i++)
		free(iso9660->primary.pathtbl[i].sorted);
	free(iso9660->primary.pathtbl);

	if (iso9660->opt.joliet) {
		isoent_free_all(iso9660->joliet.rootent);
		for (i = 0; i < iso9660->joliet.max_depth; i++)
			free(iso9660->joliet.pathtbl[i].sorted);
		free(iso9660->joliet.pathtbl);
	}

	/* Remove isofile entries. */
	isofile_free_all_entries(iso9660);
	isofile_free_hardlinks(iso9660);

	archive_string_free(&(iso9660->cur_dirstr));
	archive_string_free(&(iso9660->volume_identifier));
	archive_string_free(&(iso9660->publisher_identifier));
	archive_string_free(&(iso9660->data_preparer_identifier));
	archive_string_free(&(iso9660->application_identifier));
	archive_string_free(&(iso9660->copyright_file_identifier));
	archive_string_free(&(iso9660->abstract_file_identifier));
	archive_string_free(&(iso9660->bibliographic_file_identifier));
	archive_string_free(&(iso9660->el_torito.catalog_filename));
	archive_string_free(&(iso9660->el_torito.boot_filename));
	archive_string_free(&(iso9660->el_torito.id));
	archive_string_free(&(iso9660->utf16be));
	archive_string_free(&(iso9660->mbs));

	free(iso9660);
	a->format_data = NULL;

	return (ret);
}